

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

void __thiscall
tinyusdz::PrimMetas::update_from(PrimMetas *this,PrimMetas *rhs,bool override_authored)

{
  value_type *pvVar1;
  value_type *pvVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  
  if ((rhs->active).has_value_ == true) {
    if ((override_authored) || ((this->active).has_value_ == false)) {
      nonstd::optional_lite::optional<bool>::operator=(&this->active,&rhs->active);
      goto LAB_00208791;
    }
    if ((rhs->hidden).has_value_ != false) {
LAB_002087a2:
      if ((this->hidden).has_value_ == false) goto LAB_002087a9;
    }
  }
  else {
LAB_00208791:
    if ((rhs->hidden).has_value_ != false) {
      if (!override_authored) goto LAB_002087a2;
LAB_002087a9:
      nonstd::optional_lite::optional<bool>::operator=(&this->hidden,&rhs->hidden);
    }
  }
  if ((rhs->kind).has_value_ == true) {
    if ((override_authored) || ((this->kind).has_value_ == false)) {
      nonstd::optional_lite::optional<tinyusdz::Kind>::operator=(&this->kind,&rhs->kind);
      goto LAB_002087e5;
    }
    if ((rhs->instanceable).has_value_ != false) {
LAB_002087fc:
      if ((this->instanceable).has_value_ == false) goto LAB_00208806;
    }
  }
  else {
LAB_002087e5:
    if ((rhs->instanceable).has_value_ != false) {
      if (!override_authored) goto LAB_002087fc;
LAB_00208806:
      nonstd::optional_lite::optional<bool>::operator=(&this->instanceable,&rhs->instanceable);
    }
  }
  if ((rhs->assetInfo).has_value_ == true) {
    if ((this->assetInfo).has_value_ == true) {
      pvVar1 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&this->assetInfo);
      pvVar2 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&rhs->assetInfo);
      OverrideDictionary(pvVar1,pvVar2,override_authored);
    }
    else if (override_authored) {
      nonstd::optional_lite::
      optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
      ::operator=(&this->assetInfo,&rhs->assetInfo);
    }
  }
  if ((rhs->clips).has_value_ == true) {
    if ((this->clips).has_value_ == true) {
      pvVar1 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&this->clips);
      pvVar2 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&rhs->clips);
      OverrideDictionary(pvVar1,pvVar2,override_authored);
    }
    else if (override_authored) {
      nonstd::optional_lite::
      optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
      ::operator=(&this->clips,&rhs->clips);
    }
  }
  if ((rhs->customData).has_value_ == true) {
    if ((this->customData).has_value_ == true) {
      pvVar1 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&this->customData);
      pvVar2 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&rhs->customData);
      OverrideDictionary(pvVar1,pvVar2,override_authored);
      goto LAB_002088db;
    }
    if (!override_authored) {
      if ((rhs->doc).has_value_ != false) goto LAB_00208925;
      goto LAB_0020893b;
    }
    nonstd::optional_lite::
    optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
    ::operator=(&this->customData,&rhs->customData);
    if ((rhs->doc).has_value_ != false) goto LAB_0020892f;
    if ((rhs->comment).has_value_ != false) goto LAB_00208982;
    if ((rhs->apiSchemas).has_value_ == false) goto LAB_002089bb;
    goto LAB_002089af;
  }
LAB_002088db:
  if ((rhs->doc).has_value_ != false) {
    if (!override_authored) {
LAB_00208925:
      if ((this->doc).has_value_ != false) goto LAB_0020893b;
    }
LAB_0020892f:
    nonstd::optional_lite::optional<tinyusdz::value::StringData>::operator=(&this->doc,&rhs->doc);
  }
LAB_0020893b:
  if ((rhs->comment).has_value_ == false) {
LAB_0020898e:
    if ((rhs->apiSchemas).has_value_ != false) {
      if (!override_authored) {
LAB_002089a5:
        if ((this->apiSchemas).has_value_ != false) goto LAB_002089bb;
      }
LAB_002089af:
      nonstd::optional_lite::optional<tinyusdz::APISchemas>::operator=
                (&this->apiSchemas,&rhs->apiSchemas);
    }
  }
  else {
    if ((override_authored) || ((this->comment).has_value_ == false)) {
LAB_00208982:
      nonstd::optional_lite::optional<tinyusdz::value::StringData>::operator=
                (&this->comment,&rhs->comment);
      goto LAB_0020898e;
    }
    if ((rhs->apiSchemas).has_value_ != false) goto LAB_002089a5;
  }
LAB_002089bb:
  if ((rhs->sdrMetadata).has_value_ == true) {
    if ((this->sdrMetadata).has_value_ == true) {
      pvVar1 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&this->sdrMetadata);
      pvVar2 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&rhs->sdrMetadata);
      OverrideDictionary(pvVar1,pvVar2,override_authored);
      goto LAB_002089fd;
    }
    if (!override_authored) {
      if ((rhs->sceneName).has_value_ != false) goto LAB_00208a47;
      goto LAB_00208a5d;
    }
    nonstd::optional_lite::
    optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
    ::operator=(&this->sdrMetadata,&rhs->sdrMetadata);
    if ((rhs->sceneName).has_value_ != false) goto LAB_00208a51;
    if ((rhs->displayName).has_value_ != false) goto LAB_00208aa4;
    if ((rhs->references).has_value_ != false) goto LAB_00208ad1;
    if ((rhs->payload).has_value_ != false) goto LAB_00208b4b;
    if ((rhs->inherits).has_value_ != false) goto LAB_00208b78;
    if ((rhs->variantSets).has_value_ != false) goto LAB_00208bdd;
    if ((rhs->variants).has_value_ != false) goto LAB_00208c0a;
    if ((rhs->specializes).has_value_ == false) goto LAB_00208c43;
  }
  else {
LAB_002089fd:
    if ((rhs->sceneName).has_value_ != false) {
      if (!override_authored) {
LAB_00208a47:
        if ((this->sceneName).has_value_ != false) goto LAB_00208a5d;
      }
LAB_00208a51:
      nonstd::optional_lite::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&this->sceneName,&rhs->sceneName);
    }
LAB_00208a5d:
    if ((rhs->displayName).has_value_ == false) {
LAB_00208ab0:
      if ((rhs->references).has_value_ != false) {
        if (!override_authored) {
LAB_00208ac7:
          if ((this->references).has_value_ != false) goto LAB_00208add;
        }
LAB_00208ad1:
        nonstd::optional_lite::
        optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
        ::operator=(&this->references,&rhs->references);
      }
    }
    else {
      if ((override_authored) || ((this->displayName).has_value_ == false)) {
LAB_00208aa4:
        nonstd::optional_lite::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator=(&this->displayName,&rhs->displayName);
        goto LAB_00208ab0;
      }
      if ((rhs->references).has_value_ != false) goto LAB_00208ac7;
    }
LAB_00208add:
    if ((rhs->payload).has_value_ == false) {
LAB_00208b57:
      if ((rhs->inherits).has_value_ != false) {
        if (!override_authored) {
LAB_00208b6e:
          if ((this->inherits).has_value_ != false) goto LAB_00208b84;
        }
LAB_00208b78:
        nonstd::optional_lite::
        optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
        ::operator=(&this->inherits,&rhs->inherits);
      }
    }
    else {
      if ((override_authored) || ((this->payload).has_value_ == false)) {
LAB_00208b4b:
        nonstd::optional_lite::
        optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
        ::operator=(&this->payload,&rhs->payload);
        goto LAB_00208b57;
      }
      if ((rhs->inherits).has_value_ != false) goto LAB_00208b6e;
    }
LAB_00208b84:
    if ((rhs->variantSets).has_value_ == false) {
LAB_00208be9:
      if ((rhs->variants).has_value_ != false) {
        if (!override_authored) {
LAB_00208c00:
          if ((this->variants).has_value_ != false) goto LAB_00208c16;
        }
LAB_00208c0a:
        nonstd::optional_lite::
        optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator=(&this->variants,&rhs->variants);
      }
    }
    else {
      if ((override_authored) || ((this->variantSets).has_value_ == false)) {
LAB_00208bdd:
        nonstd::optional_lite::
        optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator=(&this->variantSets,&rhs->variantSets);
        goto LAB_00208be9;
      }
      if ((rhs->variants).has_value_ != false) goto LAB_00208c00;
    }
LAB_00208c16:
    if (((rhs->specializes).has_value_ == false) ||
       ((!override_authored && ((this->specializes).has_value_ != false)))) goto LAB_00208c43;
  }
  nonstd::optional_lite::
  optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
  ::operator=(&this->specializes,&rhs->specializes);
LAB_00208c43:
  if ((rhs->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var5 = (rhs->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(rhs->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
      sVar3 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(&this->unregisteredMetas,(key_type *)(p_Var5 + 1));
      if (override_authored || sVar3 == 0) {
        pmVar4 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->unregisteredMetas,(key_type *)(p_Var5 + 1));
        ::std::__cxx11::string::_M_assign((string *)pmVar4);
      }
    }
  }
  OverrideDictionary(&this->meta,&rhs->meta,override_authored);
  return;
}

Assistant:

void PrimMetas::update_from(const PrimMetas &rhs, const bool override_authored) {
  if (rhs.active.has_value()) {
    if (override_authored || !active.has_value()) {
      active = rhs.active;
    }
  }

  if (rhs.hidden.has_value()) {
    if (override_authored || !hidden.has_value()) {
      hidden = rhs.hidden;
    }
  }

  if (rhs.kind.has_value()) {
    if (override_authored || !kind.has_value()) {
      kind = rhs.kind;
    }
  }

  if (rhs.instanceable.has_value()) {
    if (override_authored || !instanceable.has_value()) {
      instanceable = rhs.instanceable;
    }
  }

  if (rhs.assetInfo) {
    if (assetInfo) {
      OverrideDictionary(assetInfo.value(), rhs.assetInfo.value(), override_authored);
    } else if (override_authored) {
      assetInfo = rhs.assetInfo;
    }
  }

  if (rhs.clips) {
    if (clips) {
      OverrideDictionary(clips.value(), rhs.clips.value(), override_authored);
    } else if (override_authored) {
      clips = rhs.clips;
    }
  }

  if (rhs.customData) {
    if (customData) {
      OverrideDictionary(customData.value(), rhs.customData.value(), override_authored);
    } else if (override_authored) {
      customData = rhs.customData;
    }
  }

  if (rhs.doc) {
    if (override_authored || !doc.has_value()) {
      doc = rhs.doc;
    }
  }

  if (rhs.comment) {
    if (override_authored || !comment.has_value()) {
      comment = rhs.comment;
    }
  }

  if (rhs.apiSchemas) {
    if (override_authored || !apiSchemas.has_value()) {
      apiSchemas = rhs.apiSchemas;
    }
  }

  if (rhs.sdrMetadata) {
    if (sdrMetadata) {
      OverrideDictionary(sdrMetadata.value(), rhs.sdrMetadata.value(), override_authored);
    } else if (override_authored) {
      sdrMetadata = rhs.sdrMetadata;
    }
  }

  if (rhs.sceneName) {
    if (override_authored || !sceneName.has_value()) {
      sceneName = rhs.sceneName;
    }
  }

  if (rhs.displayName) {
    if (override_authored || !displayName.has_value()) {
      displayName = rhs.displayName;
    }
  }

  if (rhs.references) {
    if (override_authored || !references.has_value()) {
      references = rhs.references;
    }
  }
  if (rhs.payload) {
    if (override_authored || !payload.has_value()) {
      payload = rhs.payload;
    }
  }
  if (rhs.inherits) {
    if (override_authored || !inherits.has_value()) {
      inherits = rhs.inherits;
    }
  }
  if (rhs.variantSets) {
    if (override_authored || !variantSets.has_value()) {
      variantSets = rhs.variantSets;
    }
  }
  if (rhs.variants) {
    if (override_authored || !variants.has_value()) {
      variants = rhs.variants;
    }
  }
  if (rhs.specializes) {
    if (override_authored || !specializes.has_value()) {
      specializes = rhs.specializes;
    }
  }

  if (rhs.unregisteredMetas.size()) {
    for (const auto &item : rhs.unregisteredMetas) {
      if (unregisteredMetas.count(item.first)) {
        if (override_authored) {
          unregisteredMetas[item.first] = item.second;
        } 
      } else {
        unregisteredMetas[item.first] = item.second;
      }
    }
  }

  OverrideDictionary(meta, rhs.meta, override_authored);
}